

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

int BrotliEncoderAttachPreparedDictionary
              (BrotliEncoderStateInternal *state,BrotliEncoderPreparedDictionary *dictionary)

{
  BrotliEncoderDictionary *pBVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  PreparedDictionary *prepared;
  bool bVar7;
  bool bVar8;
  
  uVar4 = *(uint32_t *)dictionary;
  if (uVar4 == 0xdebcede2) {
    dictionary = *(BrotliEncoderPreparedDictionary **)(dictionary + 0x20);
    uVar4 = ((PreparedDictionary *)dictionary)->magic;
  }
  if (uVar4 != 0xdebcede3) {
    if (uVar4 == 0xdebcede1) {
      if ((((state->params).dictionary.contextual.context_based == 0) &&
          ((state->params).dictionary.contextual.num_dictionaries == '\x01')) &&
         (pBVar1 = (state->params).dictionary.contextual.dict[0],
         pBVar1->hash_table_words == (uint16_t *)duckdb_brotli::kStaticDictionaryHashWords)) {
        bVar7 = pBVar1->hash_table_lengths == duckdb_brotli::kStaticDictionaryHashLengths;
      }
      else {
        bVar7 = false;
      }
      bVar8 = false;
      if (((PreparedDictionary *)((long)dictionary + 0x210))->bucket_bits == 0) {
        if (((char)((PreparedDictionary *)((long)dictionary + 0x210))->slot_bits == '\x01') &&
           (*(undefined1 **)
             (*(long *)&((PreparedDictionary *)((long)dictionary + 600))->bucket_bits + 0x18) ==
            duckdb_brotli::kStaticDictionaryHashWords)) {
          bVar8 = *(undefined1 **)
                   (*(long *)&((PreparedDictionary *)((long)dictionary + 600))->bucket_bits + 0x20)
                  == duckdb_brotli::kStaticDictionaryHashLengths;
        }
        else {
          bVar8 = false;
        }
      }
      if (state->is_initialized_ != 0) {
        return 0;
      }
      uVar4 = (state->params).dictionary.max_quality;
      uVar3 = ((PreparedDictionary *)((long)dictionary + 0x510))->bucket_bits;
      if ((int)uVar4 < (int)((PreparedDictionary *)((long)dictionary + 0x510))->bucket_bits) {
        uVar3 = uVar4;
      }
      (state->params).dictionary.max_quality = uVar3;
      uVar6 = 0;
      while (uVar2._0_4_ = ((PreparedDictionary *)dictionary)->source_size,
            uVar2._4_4_ = ((PreparedDictionary *)dictionary)->hash_bits, uVar6 < uVar2) {
        iVar5 = duckdb_brotli::AttachPreparedDictionary
                          (&(state->params).dictionary.compound,
                           *(PreparedDictionary **)
                            (&((PreparedDictionary *)((long)dictionary + 0x18))->magic + uVar6 * 2))
        ;
        uVar6 = uVar6 + 1;
        if (iVar5 == 0) {
          return 0;
        }
      }
      if (bVar8) {
        return 1;
      }
      if (bVar7) {
        switchD_01939fa4::default
                  (&(state->params).dictionary.contextual,
                   &((PreparedDictionary *)((long)dictionary + 0x210))->bucket_bits,0x300);
        (state->params).dictionary.contextual.num_instances_ = 0;
        return 1;
      }
      return 0;
    }
    if (uVar4 != 0xdebcede0) {
      return 0;
    }
  }
  iVar5 = duckdb_brotli::AttachPreparedDictionary
                    (&(state->params).dictionary.compound,(PreparedDictionary *)dictionary);
  if (iVar5 != 0) {
    return 1;
  }
  return 0;
}

Assistant:

BROTLI_BOOL BrotliEncoderAttachPreparedDictionary(BrotliEncoderState* state,
    const BrotliEncoderPreparedDictionary* dictionary) {
  /* First field of dictionary structs */
  const BrotliEncoderPreparedDictionary* dict = dictionary;
  uint32_t magic = *((const uint32_t*)dict);
  SharedEncoderDictionary* current = NULL;
  if (magic == kManagedDictionaryMagic) {
    /* Unwrap managed dictionary. */
    ManagedDictionary* managed_dictionary = (ManagedDictionary*)dict;
    magic = *managed_dictionary->dictionary;
    dict = (BrotliEncoderPreparedDictionary*)managed_dictionary->dictionary;
  }
  current = &state->params.dictionary;
  if (magic == kPreparedDictionaryMagic ||
      magic == kLeanPreparedDictionaryMagic) {
    const PreparedDictionary* prepared = (const PreparedDictionary*)dict;
    if (!AttachPreparedDictionary(&current->compound, prepared)) {
      return BROTLI_FALSE;
    }
  } else if (magic == kSharedDictionaryMagic) {
    const SharedEncoderDictionary* attached =
        (const SharedEncoderDictionary*)dict;
    BROTLI_BOOL was_default = !current->contextual.context_based &&
        current->contextual.num_dictionaries == 1 &&
        current->contextual.dict[0]->hash_table_words ==
        kStaticDictionaryHashWords &&
        current->contextual.dict[0]->hash_table_lengths ==
        kStaticDictionaryHashLengths;
    BROTLI_BOOL new_default = !attached->contextual.context_based &&
        attached->contextual.num_dictionaries == 1 &&
        attached->contextual.dict[0]->hash_table_words ==
        kStaticDictionaryHashWords &&
        attached->contextual.dict[0]->hash_table_lengths ==
        kStaticDictionaryHashLengths;
    size_t i;
    if (state->is_initialized_) return BROTLI_FALSE;
    current->max_quality =
        BROTLI_MIN(int, current->max_quality, attached->max_quality);
    for (i = 0; i < attached->compound.num_chunks; i++) {
      if (!AttachPreparedDictionary(&current->compound,
          attached->compound.chunks[i])) {
        return BROTLI_FALSE;
      }
    }
    if (!new_default) {
      if (!was_default) return BROTLI_FALSE;
      /* Copy by value, but then set num_instances_ to 0 because their memory
      is managed by attached, not by current */
      current->contextual = attached->contextual;
      current->contextual.num_instances_ = 0;
    }
  } else {
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}